

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_2e8af7c::PeerManagerImpl::GetNodeStateStats
          (PeerManagerImpl *this,NodeId nodeid,CNodeStateStats *stats)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  iterator __position;
  HeadersSyncState *pHVar3;
  int iVar4;
  _Base_ptr p_Var5;
  time_point tVar6;
  TxRelay *pTVar7;
  __int_type_conflict3 _Var8;
  _Base_ptr p_Var9;
  int iVar10;
  _Base_ptr *__args;
  rep rVar11;
  long in_FS_OFFSET;
  bool bVar12;
  PeerRef peer;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock33;
  CValidationInterface local_58;
  NetEventsInterface local_50;
  RecursiveMutex *local_48;
  undefined1 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &cs_main;
  local_40 = 0;
  std::unique_lock<std::recursive_mutex>::lock
            ((unique_lock<std::recursive_mutex> *)&stack0xffffffffffffffb8);
  p_Var1 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header;
  p_Var9 = (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var1->_M_header;
  for (; p_Var9 != (_Base_ptr)0x0; p_Var9 = (&p_Var9->_M_left)[*(long *)(p_Var9 + 1) < nodeid]) {
    if (nodeid <= *(long *)(p_Var9 + 1)) {
      p_Var5 = p_Var9;
    }
  }
  p_Var9 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var1) && (p_Var9 = p_Var5, nodeid < *(long *)(p_Var5 + 1))) {
    p_Var9 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var9 == p_Var1) {
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&stack0xffffffffffffffb8);
  }
  else {
    iVar4 = -1;
    iVar10 = -1;
    if (p_Var9[1]._M_parent != (_Base_ptr)0x0) {
      iVar10 = *(int *)&(p_Var9[1]._M_parent)->_M_right;
    }
    stats->nSyncHeight = iVar10;
    if (p_Var9[2]._M_left != (_Base_ptr)0x0) {
      iVar4 = *(int *)&(p_Var9[2]._M_left)->_M_right;
    }
    stats->nCommonHeight = iVar4;
    p_Var5 = p_Var9[3]._M_left;
    if (p_Var5 != (_Base_ptr)&p_Var9[3]._M_left) {
      do {
        if (p_Var5->_M_left != (_Base_ptr)0x0) {
          __args = &p_Var5->_M_left->_M_right;
          __position._M_current =
               (stats->vHeightInFlight).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (stats->vHeightInFlight).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&stats->vHeightInFlight,__position,
                       (int *)__args);
          }
          else {
            *__position._M_current = *(int *)__args;
            (stats->vHeightInFlight).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
        p_Var5 = *(_Base_ptr *)p_Var5;
      } while (p_Var5 != (_Base_ptr)&p_Var9[3]._M_left);
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&stack0xffffffffffffffb8);
    if ((_Rb_tree_header *)p_Var9 != p_Var1) {
      GetPeerRef((PeerManagerImpl *)&stack0xffffffffffffffa8,(NodeId)this);
      bVar12 = (Peer *)local_58._vptr_CValidationInterface != (Peer *)0x0;
      if (bVar12) {
        stats->their_services =
             ((atomic<ServiceFlags> *)(local_58._vptr_CValidationInterface + 2))->_M_i;
        stats->m_starting_height =
             (((atomic<int> *)((long)local_58._vptr_CValidationInterface + 0xc4))->
             super___atomic_base<int>)._M_i;
        if (((((atomic<unsigned_long> *)(local_58._vptr_CValidationInterface + 0x19))->
             super___atomic_base<unsigned_long>)._M_i == 0) ||
           ((((atomic<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> *)
             (local_58._vptr_CValidationInterface + 0x1a))->_M_i).__r == 0)) {
          rVar11 = 0;
        }
        else {
          tVar6 = NodeClock::now();
          rVar11 = (long)tVar6.__d.__r / 1000 -
                   (((atomic<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> *)
                    (local_58._vptr_CValidationInterface + 0x1a))->_M_i).__r;
        }
        pTVar7 = Peer::GetTxRelay((Peer *)local_58._vptr_CValidationInterface);
        if (pTVar7 == (TxRelay *)0x0) {
          stats->m_relay_txs = false;
          _Var8 = 0;
        }
        else {
          local_40 = 0;
          local_48 = &pTVar7->m_bloom_filter_mutex;
          std::unique_lock<std::recursive_mutex>::lock
                    ((unique_lock<std::recursive_mutex> *)&stack0xffffffffffffffb8);
          bVar2 = pTVar7->m_relay_txs;
          std::unique_lock<std::recursive_mutex>::~unique_lock
                    ((unique_lock<std::recursive_mutex> *)&stack0xffffffffffffffb8);
          stats->m_relay_txs = bVar2;
          _Var8 = (pTVar7->m_fee_filter_received).super___atomic_base<long>._M_i;
        }
        stats->m_fee_filter_received = _Var8;
        (stats->m_ping_wait).__r = rVar11;
        stats->m_addr_processed =
             (((atomic<unsigned_long> *)(local_58._vptr_CValidationInterface + 0x2e))->
             super___atomic_base<unsigned_long>)._M_i;
        stats->m_addr_rate_limited =
             (((atomic<unsigned_long> *)(local_58._vptr_CValidationInterface + 0x2d))->
             super___atomic_base<unsigned_long>)._M_i;
        stats->m_addr_relay_enabled =
             (bool)((((atomic_bool *)(local_58._vptr_CValidationInterface + 0x22))->_M_base)._M_i &
                   1);
        local_48 = (RecursiveMutex *)(local_58._vptr_CValidationInterface + 0x40);
        local_40 = 0;
        std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&stack0xffffffffffffffb8);
        pHVar3 = (((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)
                  (local_58._vptr_CValidationInterface + 0x45))->_M_t).
                 super___uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_HeadersSyncState_*,_std::default_delete<HeadersSyncState>_>.
                 super__Head_base<0UL,_HeadersSyncState_*,_false>._M_head_impl;
        if (pHVar3 != (HeadersSyncState *)0x0) {
          stats->presync_height = pHVar3->m_current_height;
        }
        std::unique_lock<std::mutex>::~unique_lock
                  ((unique_lock<std::mutex> *)&stack0xffffffffffffffb8);
        (stats->time_offset).__r =
             (((atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
              (local_58._vptr_CValidationInterface + 0x49))->_M_i).__r;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._vptr_NetEventsInterface !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._vptr_NetEventsInterface
                  );
      }
      goto LAB_008f41ee;
    }
  }
  bVar12 = false;
LAB_008f41ee:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar12;
}

Assistant:

bool PeerManagerImpl::GetNodeStateStats(NodeId nodeid, CNodeStateStats& stats) const
{
    {
        LOCK(cs_main);
        const CNodeState* state = State(nodeid);
        if (state == nullptr)
            return false;
        stats.nSyncHeight = state->pindexBestKnownBlock ? state->pindexBestKnownBlock->nHeight : -1;
        stats.nCommonHeight = state->pindexLastCommonBlock ? state->pindexLastCommonBlock->nHeight : -1;
        for (const QueuedBlock& queue : state->vBlocksInFlight) {
            if (queue.pindex)
                stats.vHeightInFlight.push_back(queue.pindex->nHeight);
        }
    }

    PeerRef peer = GetPeerRef(nodeid);
    if (peer == nullptr) return false;
    stats.their_services = peer->m_their_services;
    stats.m_starting_height = peer->m_starting_height;
    // It is common for nodes with good ping times to suddenly become lagged,
    // due to a new block arriving or other large transfer.
    // Merely reporting pingtime might fool the caller into thinking the node was still responsive,
    // since pingtime does not update until the ping is complete, which might take a while.
    // So, if a ping is taking an unusually long time in flight,
    // the caller can immediately detect that this is happening.
    auto ping_wait{0us};
    if ((0 != peer->m_ping_nonce_sent) && (0 != peer->m_ping_start.load().count())) {
        ping_wait = GetTime<std::chrono::microseconds>() - peer->m_ping_start.load();
    }

    if (auto tx_relay = peer->GetTxRelay(); tx_relay != nullptr) {
        stats.m_relay_txs = WITH_LOCK(tx_relay->m_bloom_filter_mutex, return tx_relay->m_relay_txs);
        stats.m_fee_filter_received = tx_relay->m_fee_filter_received.load();
    } else {
        stats.m_relay_txs = false;
        stats.m_fee_filter_received = 0;
    }

    stats.m_ping_wait = ping_wait;
    stats.m_addr_processed = peer->m_addr_processed.load();
    stats.m_addr_rate_limited = peer->m_addr_rate_limited.load();
    stats.m_addr_relay_enabled = peer->m_addr_relay_enabled.load();
    {
        LOCK(peer->m_headers_sync_mutex);
        if (peer->m_headers_sync) {
            stats.presync_height = peer->m_headers_sync->GetPresyncHeight();
        }
    }
    stats.time_offset = peer->m_time_offset;

    return true;
}